

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

void __thiscall
FCompressedMemFile::GetSizes(FCompressedMemFile *this,uint *compressed,uint *uncompressed)

{
  uint uVar1;
  uint *uncompressed_local;
  uint *compressed_local;
  FCompressedMemFile *this_local;
  
  if (this->m_ImplodedBuffer == (uchar *)0x0) {
    *compressed = 0;
    *uncompressed = (this->super_FCompressedFile).m_BufferSize;
  }
  else {
    uVar1 = BigLong(*(uint *)this->m_ImplodedBuffer);
    *compressed = uVar1;
    uVar1 = BigLong(*(uint *)(this->m_ImplodedBuffer + 4));
    *uncompressed = uVar1;
  }
  return;
}

Assistant:

void FCompressedMemFile::GetSizes(unsigned int &compressed, unsigned int &uncompressed) const
{
	if (m_ImplodedBuffer != NULL)
	{
		compressed = BigLong(*(unsigned int *)m_ImplodedBuffer);
		uncompressed = BigLong(*(unsigned int *)(m_ImplodedBuffer + 4));
	}
	else
	{
		compressed = 0;
		uncompressed = m_BufferSize;
	}
}